

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void gen_hermite_dr_compute(int order,double alpha,double *x,double *w)

{
  double *weight;
  double *xtab;
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  if (order == 1) {
    *x = 0.0;
    dVar7 = tgamma((alpha + 1.0) * 0.5);
    *w = dVar7;
    return;
  }
  uVar5 = order - (order >> 0x1f) & 0xfffffffe;
  dVar8 = alpha + 1.0;
  dVar7 = dVar8;
  if (order == uVar5) {
    dVar7 = alpha + -1.0;
  }
  iVar4 = order - (uint)(order != uVar5);
  lVar3 = (long)(iVar4 / 2);
  uVar2 = 0xffffffffffffffff;
  if (-2 < iVar4) {
    uVar2 = lVar3 * 8;
  }
  weight = (double *)operator_new__(uVar2);
  xtab = (double *)operator_new__(uVar2);
  gen_laguerre_ss_compute(iVar4 / 2,dVar7 * 0.5,xtab,weight);
  if (order == uVar5) {
    if (1 < iVar4) {
      pdVar1 = xtab + lVar3 + -1;
      lVar6 = 0;
      do {
        dVar7 = *pdVar1;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        x[lVar6] = -dVar7;
        lVar6 = lVar6 + 1;
        pdVar1 = pdVar1 + -1;
      } while (lVar3 != lVar6);
      if (1 < iVar4) {
        lVar6 = 0;
        do {
          dVar7 = xtab[lVar6];
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          x[lVar3 + lVar6] = dVar7;
          lVar6 = lVar6 + 1;
        } while (lVar3 != lVar6);
        if (1 < iVar4) {
          pdVar1 = weight + lVar3;
          lVar6 = 0;
          do {
            pdVar1 = pdVar1 + -1;
            w[lVar6] = *pdVar1 * 0.5;
            lVar6 = lVar6 + 1;
          } while (lVar3 != lVar6);
          if (1 < iVar4) {
            lVar6 = 0;
            do {
              w[lVar3 + lVar6] = weight[lVar6] * 0.5;
              lVar6 = lVar6 + 1;
            } while (lVar3 != lVar6);
          }
        }
      }
    }
  }
  else if (order % 2 == 1) {
    if (iVar4 < 2) {
      x[lVar3] = 0.0;
    }
    else {
      pdVar1 = xtab + lVar3 + -1;
      lVar6 = 0;
      do {
        dVar7 = *pdVar1;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        x[lVar6] = -dVar7;
        lVar6 = lVar6 + 1;
        pdVar1 = pdVar1 + -1;
      } while (lVar3 != lVar6);
      x[lVar3] = 0.0;
      if (1 < iVar4) {
        lVar6 = 0;
        do {
          dVar7 = xtab[lVar6];
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          x[lVar3 + lVar6 + 1] = dVar7;
          lVar6 = lVar6 + 1;
        } while (lVar3 != lVar6);
        if (1 < iVar4) {
          lVar6 = 0;
          pdVar1 = w;
          do {
            *pdVar1 = (weight[lVar3 + lVar6 + -1] * 0.5) / xtab[lVar3 + lVar6 + -1];
            lVar6 = lVar6 + -1;
            pdVar1 = pdVar1 + 1;
          } while (-lVar6 != lVar3);
          dVar7 = tgamma(dVar8 * 0.5);
          w[lVar3] = dVar7;
          if (1 < iVar4) {
            lVar6 = 0;
            do {
              dVar7 = dVar7 - weight[lVar6] / xtab[lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar3 != lVar6);
            w[lVar3] = dVar7;
            if (1 < iVar4) {
              lVar6 = 0;
              do {
                w[lVar3 + lVar6 + 1] = (weight[lVar6] * 0.5) / xtab[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar3 != lVar6);
            }
          }
          goto LAB_001dc5d3;
        }
      }
    }
    dVar7 = tgamma(dVar8 * 0.5);
    w[lVar3] = dVar7;
  }
LAB_001dc5d3:
  operator_delete__(weight);
  operator_delete__(xtab);
  return;
}

Assistant:

void gen_hermite_dr_compute ( int order, double alpha, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    GEN_HERMITE_DR_COMPUTE computes a generalized Gauss-Hermite rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -oo < x < +oo ) |x|^ALPHA exp(-x^2) f(x) dx
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    02 March 2008
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//  Parameters:
//
//    Input, int ORDER, the order.
//
//    Input, double ALPHA, the parameter.
//    -1.0 < ALPHA.
//
//    Output, double X[ORDER], the abscissas.
//
//    Output, double W[ORDER], the weights.
//
{
  double alpha_laguerre;
  double arg;
  int i;
  int order_laguerre;
  double *w_laguerre;
  double *x_laguerre;

  if ( order == 1 )
  {
    arg = ( alpha + 1.0 ) / 2.0;
    x[0] = 0.0;
    w[0] = tgamma ( arg );
    return;
  }

  if ( ( order % 2 ) == 0 ) 
  {
    order_laguerre = order / 2;
    alpha_laguerre = ( alpha - 1.0 ) / 2.0;
  }
  else
  {
    order_laguerre = ( order - 1 ) / 2;
    alpha_laguerre = ( alpha + 1.0 ) / 2.0;
  }
  
  w_laguerre = new double[order_laguerre];
  x_laguerre = new double[order_laguerre];

  gen_laguerre_ss_compute ( order_laguerre, alpha_laguerre, 
    x_laguerre, w_laguerre );

  if ( ( order % 2 ) == 0 )
  {
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[i] = - sqrt ( x_laguerre[order_laguerre-1-i] );
    }
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[order_laguerre+i] = sqrt ( x_laguerre[i] );
	}
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[i] = 0.5 * w_laguerre[order_laguerre-1-i];
    }
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[order_laguerre+i] = 0.5 * w_laguerre[i];
    }
  }
  else if ( ( order % 2 ) == 1 )
  {
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[i] = - sqrt ( x_laguerre[order_laguerre-1-i] );
    }
    x[order_laguerre] = 0.0;
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[order_laguerre+1+i] = sqrt ( x_laguerre[i] );
	}
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[i] = 0.5 * w_laguerre[order_laguerre-1-i] / x_laguerre[order_laguerre-1-i];
    }

    arg = ( alpha + 1.0 ) / 2.0;
    w[order_laguerre] = tgamma ( arg );
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[order_laguerre] = w[order_laguerre] - w_laguerre[i] / x_laguerre[i];
    }

    for ( i = 0; i < order_laguerre; i++ )
    {
      w[order_laguerre+1+i] = 0.5 * w_laguerre[i] / x_laguerre[i];
    }
  }
  delete [] w_laguerre;
  delete [] x_laguerre;

  return;
}